

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

string * __thiscall
glcts::ArraysOfArrays::ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::
prepare_geometry_shader
          (string *__return_storage_ptr__,
          ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type,string *tested_declaration,string *tested_snippet)

{
  TestError *this_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (COMPUTE_SHADER_TYPE < tested_shader_type) {
    if (tested_shader_type - TESSELATION_CONTROL_SHADER_TYPE < 2) {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
    else {
      if (tested_shader_type != GEOMETRY_SHADER_TYPE) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unrecognized shader object type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xfc4);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionsLength1<API>::prepare_geometry_shader(
	typename TestCaseBase<API>::TestShaderType tested_shader_type, const std::string& tested_declaration,
	const std::string& tested_snippet)
{
	std::string geometry_shader_source;

	switch (tested_shader_type)
	{
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		break;

	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		geometry_shader_source = "layout(points)                           in;\n"
								 "layout(triangle_strip, max_vertices = 4) out;\n"
								 "\n"
								 "in  float tes_result[];\n"
								 "out float fs_result;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    gl_Position  = vec4(-1, -1, 0, 1);\n"
								 "    fs_result    = tes_result[0];\n"
								 "    EmitVertex();\n"
								 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
								 "    fs_result    = tes_result[0];\n"
								 "    EmitVertex();\n"
								 "    gl_Position  = vec4(1, -1, 0, 1);\n"
								 "    fs_result    = tes_result[0];\n"
								 "    EmitVertex();\n"
								 "    gl_Position  = vec4(1, 1, 0, 1);\n"
								 "    fs_result    = tes_result[0];\n"
								 "    EmitVertex();\n"
								 "}\n";
		break;

	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		geometry_shader_source = "layout(points)                           in;\n"
								 "layout(triangle_strip, max_vertices = 4) out;\n"
								 "\n"
								 "out float fs_result;\n"
								 "\n"
								 "void main()\n"
								 "{\n";
		geometry_shader_source += tested_declaration;
		geometry_shader_source += "    float result = 1.0;\n\n";
		geometry_shader_source += tested_snippet;
		geometry_shader_source += "\n    gl_Position  = vec4(-1, -1, 0, 1);\n"
								  "    fs_result    = result;\n"
								  "    EmitVertex();\n"
								  "    gl_Position  = vec4(-1, 1, 0, 1);\n"
								  "    fs_result    = result;\n"
								  "    EmitVertex();\n"
								  "    gl_Position  = vec4(1, -1, 0, 1);\n"
								  "    fs_result    = result;\n"
								  "    EmitVertex();\n"
								  "    gl_Position  = vec4(1, 1, 0, 1);\n"
								  "    fs_result    = result;\n"
								  "    EmitVertex();\n"
								  "}\n";
		break;

	default:
		TCU_FAIL("Unrecognized shader object type.");
		break;
	}

	return geometry_shader_source;
}